

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Metadata::MergePartialFromCodedStream(Metadata *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short sVar6;
  uint uVar7;
  int iVar8;
  uint32 uVar9;
  pair<int,_int> pVar10;
  uint uVar11;
  ulong uVar12;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *local_38;
  
  local_38 = &this->userdefined_;
  local_40 = &(this->userdefined_).map_;
  local_48 = &this->license_;
  local_50 = &this->author_;
  local_58 = &this->versionstring_;
  do {
    pbVar3 = input->buffer_;
    uVar9 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar9 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar9 = (uint)bVar2, (~(uint)*pbVar1 & uVar11) < 0x80)) goto LAB_001fab8f;
        uVar11 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = (ulong)uVar11 | 0x100000000;
    }
    else {
LAB_001fab8f:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar12 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar9 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) {
switchD_001fa9d8_default:
      iVar8 = 7;
      if ((uVar11 & 7) != 4 && uVar11 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar11);
        if (bVar5) goto LAB_001fab81;
        iVar8 = 6;
      }
    }
    else {
      uVar7 = (uint)(uVar12 >> 3) & 0x1fffffff;
      if (uVar7 != 100) {
        switch(uVar7) {
        case 1:
          MergePartialFromCodedStream();
          sVar6 = extraout_AX;
          break;
        case 2:
          MergePartialFromCodedStream();
          sVar6 = extraout_AX_02;
          break;
        case 3:
          MergePartialFromCodedStream();
          sVar6 = extraout_AX_00;
          break;
        case 4:
          MergePartialFromCodedStream();
          sVar6 = extraout_AX_01;
          break;
        default:
          goto switchD_001fa9d8_default;
        }
        if (sVar6 == 0) goto switchD_001fa9d8_default;
        if (sVar6 == 1) goto LAB_001fab81;
        iVar8 = (int)local_98.mf_;
        goto LAB_001fab84;
      }
      if ((char)uVar12 != '\"') goto switchD_001fa9d8_default;
      local_98.mf_ = local_38;
      local_98.map_ = local_40;
      local_98.key_._M_dataplus._M_p = (pointer)&local_98.key_.field_2;
      local_98.key_._M_string_length = 0;
      local_98.key_.field_2._M_local_buf[0] = '\0';
      local_98.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
            *)0x0;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < iVar8;
      }
      if ((((bVar5) &&
           (pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar8), -1 < (long)pVar10)) &&
          (bVar5 = google::protobuf::internal::
                   MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                   ::
                   Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::MergePartialFromCodedStream(&local_98,input), bVar5)) &&
         (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar10.first), bVar5)) {
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (local_98.key_._M_dataplus._M_p,(int)local_98.key_._M_string_length,PARSE,
                           "CoreML.Specification.Metadata.UserDefinedEntry.key");
        if (!bVar5) goto LAB_001faad0;
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (((local_98.value_ptr_)->_M_dataplus)._M_p,
                           (int)(local_98.value_ptr_)->_M_string_length,PARSE,
                           "CoreML.Specification.Metadata.UserDefinedEntry.value");
        iVar8 = 6;
        if (bVar5) {
          iVar8 = 0;
        }
      }
      else {
LAB_001faad0:
        bVar5 = false;
        iVar8 = 6;
      }
      if (local_98.entry_.ptr_ !=
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
           *)0x0) {
        (*((local_98.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.key_._M_dataplus._M_p != &local_98.key_.field_2) {
        operator_delete(local_98.key_._M_dataplus._M_p,
                        CONCAT71(local_98.key_.field_2._M_allocated_capacity._1_7_,
                                 local_98.key_.field_2._M_local_buf[0]) + 1);
      }
      if (bVar5 != false) {
LAB_001fab81:
        iVar8 = 0;
      }
    }
LAB_001fab84:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool Metadata::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Metadata)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string shortDescription = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_shortdescription()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->shortdescription().data(), this->shortdescription().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.shortDescription"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string versionString = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_versionstring()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->versionstring().data(), this->versionstring().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.versionString"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string author = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_author()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->author().data(), this->author().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.author"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string license = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_license()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->license().data(), this->license().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.license"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, string> userDefined = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          Metadata_UserDefinedEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Metadata_UserDefinedEntry,
              ::std::string, ::std::string,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              0 >,
            ::google::protobuf::Map< ::std::string, ::std::string > > parser(&userdefined_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.key"));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.value().data(), parser.value().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.value"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Metadata)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Metadata)
  return false;
#undef DO_
}